

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int findIndexCol(Parse *pParse,ExprList *pList,int iBase,Index *pIdx,int iCol)

{
  byte bVar1;
  byte *pbVar2;
  Expr *pExpr;
  Expr *pEVar3;
  bool bVar4;
  CollSeq *pCVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  int local_44;
  
  if (0 < pList->nExpr) {
    pbVar2 = (byte *)pIdx->azColl[iCol];
    lVar8 = 0;
    do {
      pExpr = pList->a[lVar8].pExpr;
      for (pEVar3 = pExpr;
          (pEVar3 != (Expr *)0x0 && ((pEVar3->op == '\\' || (pEVar3->op == '\x18'))));
          pEVar3 = pEVar3->pLeft) {
      }
      bVar4 = true;
      if ((((pEVar3->op == 0x98) && (pIdx->aiColumn[iCol] == (int)pEVar3->iColumn)) &&
          (pEVar3->iTable == iBase)) &&
         (pCVar5 = sqlite3ExprCollSeq(pParse,pExpr), pCVar5 != (CollSeq *)0x0)) {
        pbVar7 = (byte *)pCVar5->zName;
        bVar1 = *pbVar7;
        pbVar6 = pbVar2;
        while ((bVar1 != 0 && (pbVar7 = pbVar7 + 1, ""[bVar1] == ""[*pbVar6]))) {
          pbVar6 = pbVar6 + 1;
          bVar1 = *pbVar7;
        }
        if (""[bVar1] == ""[*pbVar6]) {
          bVar4 = false;
          local_44 = (int)lVar8;
        }
      }
      if (!bVar4) {
        return local_44;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pList->nExpr);
  }
  return -1;
}

Assistant:

static int findIndexCol(
  Parse *pParse,                  /* Parse context */
  ExprList *pList,                /* Expression list to search */
  int iBase,                      /* Cursor for table associated with pIdx */
  Index *pIdx,                    /* Index to match column of */
  int iCol                        /* Column of index to match */
){
  int i;
  const char *zColl = pIdx->azColl[iCol];

  for(i=0; i<pList->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollate(pList->a[i].pExpr);
    if( p->op==TK_COLUMN
     && p->iColumn==pIdx->aiColumn[iCol]
     && p->iTable==iBase
    ){
      CollSeq *pColl = sqlite3ExprCollSeq(pParse, pList->a[i].pExpr);
      if( ALWAYS(pColl) && 0==sqlite3StrICmp(pColl->zName, zColl) ){
        return i;
      }
    }
  }

  return -1;
}